

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_chop_u16(nng_msg *m,uint16_t *vp)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  void *pvVar4;
  uint16_t v;
  uint8_t *body;
  uint16_t *vp_local;
  nng_msg *m_local;
  
  sVar3 = nni_msg_len(m);
  if (sVar3 < 2) {
    m_local._4_4_ = 3;
  }
  else {
    pvVar4 = nni_msg_body(m);
    sVar3 = nni_msg_len(m);
    bVar1 = *(byte *)((long)pvVar4 + (sVar3 - 2));
    bVar2 = *(byte *)((long)pvVar4 + (sVar3 - 1));
    nni_msg_chop(m,2);
    *vp = (ushort)bVar1 * 0x100 + (ushort)bVar2;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nng_msg_chop_u16(nng_msg *m, uint16_t *vp)
{
	uint8_t *body;
	uint16_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET16(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}